

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<void*>
          (BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,
          MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          **value)

{
  long lVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  DictionaryStats *this_00;
  uint uVar5;
  
  lVar1 = *(long *)this;
  uVar4 = 0;
  if (lVar1 != 0) {
    hVar3 = Js::SameValueComparerCommon<void_*,_true>::GetHashCode(*key);
    uVar4 = BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hVar3 * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar5 = *(uint *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      lVar1 = *(long *)(this + 8);
      uVar4 = 0;
      do {
        bVar2 = Js::JavascriptConversion::SameValueCommon<true>
                          (*(Var *)(lVar1 + 0x10 + (ulong)uVar5 * 0x18),*key);
        if (bVar2) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00ce5085;
        }
        uVar4 = uVar4 + 1;
        uVar5 = *(uint *)(lVar1 + (ulong)uVar5 * 0x18 + 8);
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar5 = 0xffffffff;
LAB_00ce5085:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  if (-1 < (int)uVar5) {
    *value = *(MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               **)(*(long *)(this + 8) + (ulong)uVar5 * 0x18);
  }
  return -1 < (int)uVar5;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }